

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O0

int picnic_keygen(picnic_params_t param,picnic_publickey_t *pk,picnic_privatekey_t *sk)

{
  byte bVar1;
  int iVar2;
  picnic_instance_t *ppVar3;
  uint8_t *dst;
  undefined1 *num_bits;
  undefined1 *in_RDX;
  long in_RSI;
  picnic_params_t in_EDI;
  uint8_t *sk_c;
  uint8_t *sk_pt;
  uint8_t *sk_sk;
  picnic_instance_t *instance;
  picnic_publickey_t *in_stack_00000058;
  picnic_privatekey_t *in_stack_00000060;
  int local_4;
  
  if ((in_RSI == 0) || (in_RDX == (undefined1 *)0x0)) {
    local_4 = -1;
  }
  else {
    ppVar3 = picnic_instance_get(in_EDI);
    if (ppVar3 == (picnic_instance_t *)0x0) {
      local_4 = -1;
    }
    else {
      dst = in_RDX + 1;
      num_bits = in_RDX + (int)((uint)ppVar3->input_output_size * 2 + 1);
      bVar1 = ppVar3->input_output_size;
      *in_RDX = (char)in_EDI;
      iVar2 = rand_bits(dst,(size_t)num_bits);
      if (iVar2 == 0) {
        iVar2 = rand_bits(dst,(size_t)num_bits);
        if (iVar2 == 0) {
          iVar2 = picnic_sk_to_pk(in_stack_00000060,in_stack_00000058);
          if (iVar2 == 0) {
            memcpy(in_RDX + (int)(bVar1 + 1),(void *)(in_RSI + 1),(ulong)ppVar3->input_output_size);
            local_4 = 0;
          }
          else {
            local_4 = -1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_keygen(picnic_params_t param, picnic_publickey_t* pk,
                                            picnic_privatekey_t* sk) {

  if (!pk || !sk) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  uint8_t* sk_sk = SK_SK(sk);
  uint8_t* sk_pt = SK_PT(sk, instance);
  uint8_t* sk_c  = SK_C(sk, instance);

  // generate private key
  sk->data[0] = param;
  // random secret key
  if (rand_bits(sk_sk, instance->lowmc.n)) {
    return -1;
  }
  // random plain text
  if (rand_bits(sk_pt, instance->lowmc.n)) {
    return -1;
  }
  // encrypt plaintext under secret key
  if (picnic_sk_to_pk(sk, pk)) {
    return -1;
  }
  // copy ciphertext to secret key
  memcpy(sk_c, PK_C(pk), instance->input_output_size);
  return 0;
}